

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::CastToFloat(VirtualMachine *this)

{
  int iVar1;
  __buckets_ptr __nptr;
  element_type *peVar2;
  __buckets_ptr pp_Var3;
  anon_union_8_6_52c89740_for_Variable_1 extraout_RDX;
  undefined8 uVar4;
  anon_union_8_6_52c89740_for_Variable_1 aVar5;
  Variable v;
  Variable VVar6;
  string local_50;
  
  VVar6 = popOpStack(this);
  aVar5 = VVar6.field_1;
  switch(VVar6.type) {
  case Undefined:
  case Boolean:
  case Object:
  case Function:
    uVar4 = 0;
    aVar5.integerValue = 0;
    break;
  case Integer:
switchD_00116d6c_caseD_1:
    aVar5.doubleValue = (double)aVar5.integerValue;
  case Float:
    uVar4 = 3;
    break;
  case String:
    __nptr = ((aVar5.objectValue)->properties)._M_h._M_buckets;
    pp_Var3 = (__buckets_ptr)__errno_location();
    iVar1 = *(int *)pp_Var3;
    *(int *)pp_Var3 = 0;
    aVar5.stringValue = (string *)strtod((char *)__nptr,&local_50);
    if ((__buckets_ptr)local_50._M_dataplus._M_p == __nptr) {
      uVar4 = std::__throw_invalid_argument("stod");
      if ((__buckets_ptr)local_50._M_dataplus._M_p != pp_Var3) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar4);
    }
    if (*(int *)pp_Var3 == 0) {
      *(int *)pp_Var3 = iVar1;
    }
    else if (*(int *)pp_Var3 == 0x22) {
      std::__throw_out_of_range("stod");
      aVar5 = extraout_RDX;
      goto switchD_00116d6c_caseD_1;
    }
    VVar6.field_1.doubleValue = (double)aVar5.integerValue;
    VVar6._0_8_ = 3;
    pushOpStack(this,VVar6);
    goto LAB_00116dd3;
  default:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Unknown varible type at variableEquals","");
    panic(this,&local_50);
  }
  v.field_1.integerValue = aVar5.integerValue;
  v._0_8_ = uVar4;
  pushOpStack(this,v);
LAB_00116dd3:
  peVar2 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2->programCounter = peVar2->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::CastToFloat() {
  Variable top = this->popOpStack();

  switch (top.type) {
    case VariableType::Integer: {
      this->pushFloat(static_cast<double>(top.integerValue));
      break;
    }
    case VariableType::Float: {
      this->pushFloat(top.doubleValue);
      break;
    }
    case VariableType::Function: {
      this->pushUndefined();
      break;
    }
    case VariableType::Object: {
      this->pushUndefined();
      break;
    }
    case VariableType::String: {
      try {
        double val = std::stod(*top.stringValue);
        this->pushFloat(val);

      } catch (...) {
        this->pushUndefined();
      }
      break;
    }
    case VariableType::Undefined: {
      this->pushUndefined();
      break;
    }
    case VariableType::Boolean: {
      this->pushUndefined();
      break;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }

  this->advance();
}